

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash_test.cc
# Opt level: O0

unique_ptr<char[],_std::default_delete<char[]>_> anon_unknown.dwarf_346899::RandString(void)

{
  int iVar1;
  byte *pbVar2;
  type pcVar3;
  uint uVar4;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> in_RDI;
  undefined4 local_1c;
  uint i;
  uint len;
  __array *ret;
  
  iVar1 = rand();
  uVar4 = iVar1 % 3 + 1;
  std::make_unique<char[]>
            ((size_t)in_RDI.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl);
  for (local_1c = 0; local_1c < uVar4; local_1c = local_1c + 1) {
    iVar1 = rand();
    pbVar2 = (byte *)std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                               ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                                in_RDI.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                super__Head_base<0UL,_char_*,_false>._M_head_impl,(ulong)local_1c);
    *pbVar2 = (byte)iVar1 & 7 | 0x30;
  }
  pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                      in_RDI.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                      super__Head_base<0UL,_char_*,_false>._M_head_impl,(ulong)uVar4);
  *pcVar3 = '\0';
  return (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (tuple<char_*,_std::default_delete<char[]>_>)
         in_RDI.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<char[]> RandString(void) {
  unsigned len = 1 + (rand() % 3);
  auto ret = std::make_unique<char[]>(len + 1);

  for (unsigned i = 0; i < len; i++) {
    ret[i] = '0' + (rand() & 7);
  }
  ret[len] = 0;

  return ret;
}